

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData160 * __thiscall
cfd::core::HashUtil::Output160(ByteData160 *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  string local_40;
  
  if (this->hash_type_ == '\x02') {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                       &this->buffer_);
    Hash160(__return_storage_ptr__,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  }
  else {
    if (this->hash_type_ != '\x01') {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown hash type.","")
      ;
      CfdException::CfdException(this_00,kCfdInternalError,&local_40);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                       &this->buffer_);
    Ripemd160(__return_storage_ptr__,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  }
  if (local_40._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Output160() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes());
    case kHash160:
      return Hash160(buffer_.GetBytes());
    case kSha256:
      // fall-through
    case kSha256D:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}